

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_c7dac::AddInteractionBPM_basic_Test::~AddInteractionBPM_basic_Test
          (AddInteractionBPM_basic_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(AddInteractionBPM, basic) {
   
   Polynomial<uint32_t, double> polynomial {
      {{1}, 1.0}, {{2}, 2.0},
      {{1, 2}, 12.0},
      {{1, 2, 3}, 123.0}
   };
   
   BinaryPolynomialModel<uint32_t, double> bpm(polynomial, Vartype::SPIN);
   
   bpm.AddInteraction({3}, 3.0);
   bpm.AddInteraction({4}, 4.0);
   bpm.AddInteraction({1, 3}, 13.0);
   bpm.AddInteraction({1, 4}, 14.0);
   bpm.AddInteraction({2, 3}, 23.0);
   bpm.AddInteraction({2, 4}, 24.0);
   bpm.AddInteraction({3, 4}, 34.0);
   bpm.AddInteraction({1, 2, 4}, 124.0);
   bpm.AddInteraction({1, 3, 4}, 134.0);
   bpm.AddInteraction({2, 3, 4}, 234.0);
   bpm.AddInteraction({1, 2, 3, 4}, 1234.0);
   
   StateTestBPMUINT(bpm);

}